

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

void __thiscall
duckdb::BatchInsertLocalState::CreateNewCollection
          (BatchInsertLocalState *this,ClientContext *context,DuckTableEntry *table_entry,
          vector<duckdb::LogicalType,_true> *insert_types)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 extraout_var_00;
  TableIOManager *args_1;
  pointer pRVar3;
  undefined4 extraout_var_01;
  PhysicalIndex PVar4;
  templated_unique_single_t collection;
  shared_ptr<duckdb::DataTableInfo,_true> table_info;
  unsigned_long max_row_id;
  __uniq_ptr_impl<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
  local_50;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_48;
  __shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> local_40;
  unsigned_long local_30;
  
  iVar1 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
  p_Var2 = (__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)
           DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar1));
  ::std::__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,p_Var2);
  iVar1 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
  args_1 = TableIOManager::Get((DataTable *)CONCAT44(extraout_var_00,iVar1));
  local_30 = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
  make_uniq<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>,duckdb::TableIOManager&,duckdb::vector<duckdb::LogicalType,true>const&,unsigned_long&>
            ((duckdb *)&local_50,(shared_ptr<duckdb::DataTableInfo,_true> *)&local_40,args_1,
             insert_types,&local_30);
  pRVar3 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
           ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                         *)&local_50);
  RowGroupCollection::InitializeEmpty(pRVar3);
  pRVar3 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
           ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                         *)&local_50);
  RowGroupCollection::InitializeAppend(pRVar3,&this->current_append_state);
  iVar1 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
  local_48._M_head_impl =
       (RowGroupCollection *)
       local_50._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
       .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl;
  local_50._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
  .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl =
       (tuple<duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>)
       (_Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
        )0x0;
  PVar4 = DataTable::CreateOptimisticCollection
                    ((DataTable *)CONCAT44(extraout_var_01,iVar1),context,
                     (unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                      *)&local_48);
  (this->collection_index).index = PVar4.index;
  ::std::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
               *)&local_48);
  ::std::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
               *)&local_50);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void CreateNewCollection(ClientContext &context, DuckTableEntry &table_entry,
	                         const vector<LogicalType> &insert_types) {
		auto table_info = table_entry.GetStorage().GetDataTableInfo();
		auto &io_manager = TableIOManager::Get(table_entry.GetStorage());

		// Create the local row group collection.
		auto max_row_id = NumericCast<idx_t>(MAX_ROW_ID);
		auto collection = make_uniq<RowGroupCollection>(std::move(table_info), io_manager, insert_types, max_row_id);
		collection->InitializeEmpty();
		collection->InitializeAppend(current_append_state);

		auto &data_table = table_entry.GetStorage();
		collection_index = data_table.CreateOptimisticCollection(context, std::move(collection));
	}